

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::TrimMessage
          (FieldMaskTree *this,Node *node,Message *message)

{
  FieldDescriptor *field;
  long lVar1;
  once_flag *__once;
  FieldMaskTree *this_00;
  Reflection *pRVar2;
  bool bVar3;
  int iVar4;
  LogMessage *other;
  const_iterator cVar5;
  Node *node_00;
  Reflection *extraout_RDX;
  Message *message_00;
  long lVar6;
  LogMessage local_a0;
  long local_68;
  _Base_ptr local_60;
  long local_58;
  FieldDescriptor *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  *local_48;
  Reflection *local_40;
  undefined4 local_34;
  
  local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)this;
  if ((this->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x24d);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_a0,"CHECK failed: !node->children.empty(): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  local_68 = (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  if ((long)*(int *)(local_68 + 0x68) < 1) {
    local_34 = 0;
  }
  else {
    local_60 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
                   *)&(local_48->_M_t)._M_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_58 = (long)*(int *)(local_68 + 0x68) * 0x98;
    lVar6 = 0;
    local_34 = 0;
    local_40 = extraout_RDX;
    do {
      lVar1 = *(long *)(local_68 + 0x28);
      field = (FieldDescriptor *)(lVar1 + lVar6);
      cVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              ::find(local_48,*(key_type **)(lVar1 + lVar6));
      pRVar2 = local_40;
      if (cVar5._M_node == local_60) {
        if (*(int *)(lVar1 + 0x3c + lVar6) == 3) {
          iVar4 = Reflection::FieldSize(local_40,(Message *)node,field);
          bVar3 = iVar4 != 0;
        }
        else {
          bVar3 = Reflection::HasField(local_40,(Message *)node,field);
        }
        local_34 = CONCAT31((int3)((uint)local_34 >> 8),(byte)local_34 | bVar3);
        Reflection::ClearField(pRVar2,(Message *)node,field);
      }
      else {
        __once = *(once_flag **)(lVar1 + 0x30 + lVar6);
        if (__once != (once_flag *)0x0) {
          local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,(_func_void_FieldDescriptor_ptr **)&local_a0,&local_50);
        }
        pRVar2 = local_40;
        if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                      (ulong)*(uint *)(lVar1 + 0x38 + lVar6) * 4) == 10) &&
            (this_00 = *(FieldMaskTree **)(cVar5._M_node + 2),
            (this_00->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
           (bVar3 = Reflection::HasField(local_40,(Message *)node,field), bVar3)) {
          node_00 = (Node *)Reflection::MutableMessage
                                      (pRVar2,(Message *)node,field,(MessageFactory *)0x0);
          bVar3 = TrimMessage(this_00,node_00,message_00);
          local_34 = CONCAT31((int3)((uint)local_34 >> 8),(byte)local_34 | bVar3);
        }
      }
      lVar6 = lVar6 + 0x98;
    } while (local_58 != lVar6);
  }
  return (bool)((byte)local_34 & 1);
}

Assistant:

bool FieldMaskTree::TrimMessage(const Node* node, Message* message) {
  GOOGLE_DCHECK(!node->children.empty());
  const Reflection* reflection = message->GetReflection();
  const Descriptor* descriptor = message->GetDescriptor();
  const int32 field_count = descriptor->field_count();
  bool modified = false;
  for (int index = 0; index < field_count; ++index) {
    const FieldDescriptor* field = descriptor->field(index);
    std::map<std::string, Node*>::const_iterator it =
        node->children.find(field->name());
    if (it == node->children.end()) {
      if (field->is_repeated()) {
        if (reflection->FieldSize(*message, field) != 0) {
          modified = true;
        }
      } else {
        if (reflection->HasField(*message, field)) {
          modified = true;
        }
      }
      reflection->ClearField(message, field);
    } else {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        Node* child = it->second;
        if (!child->children.empty() && reflection->HasField(*message, field)) {
          bool nestedMessageChanged =
              TrimMessage(child, reflection->MutableMessage(message, field));
          modified = nestedMessageChanged || modified;
        }
      }
    }
  }
  return modified;
}